

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack30_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3fffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1e;
  *puVar1 = (in[1] & 0xfffffff) << 2 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x1c;
  *puVar1 = (in[2] & 0x3ffffff) << 4 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x1a;
  *puVar1 = (in[3] & 0xffffff) << 6 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x18;
  *puVar1 = (in[4] & 0x3fffff) << 8 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0x16;
  *puVar1 = (in[5] & 0xfffff) << 10 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 0x14;
  *puVar1 = (in[6] & 0x3ffff) << 0xc | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[6] >> 0x12;
  *puVar1 = (in[7] & 0xffff) << 0xe | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[7] >> 0x10;
  *puVar1 = (in[8] & 0x3fff) << 0x10 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[8] >> 0xe;
  *puVar1 = (in[9] & 0xfff) << 0x12 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[9] >> 0xc;
  *puVar1 = (in[10] & 0x3ff) << 0x14 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[10] >> 10;
  *puVar1 = (in[0xb] & 0xff) << 0x16 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xb] >> 8;
  *puVar1 = (in[0xc] & 0x3f) << 0x18 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xc] >> 6;
  *puVar1 = (in[0xd] & 0xf) << 0x1a | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xd] >> 4;
  *puVar1 = (in[0xe] & 3) << 0x1c | *puVar1;
  out[0xf] = in[0xe] >> 2;
  return in + 0xf;
}

Assistant:

const uint32_t *__fastunpack30_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 14)) << (30 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 12)) << (30 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 10)) << (30 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 8)) << (30 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 6)) << (30 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 4)) << (30 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 2)) << (30 - 2);
  out++;
  *out = ((*in) >> 2);
  ++in;
  out++;

  return in;
}